

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS ref_shard_mark_relax(REF_SHARD ref_shard)

{
  REF_CELL ref_cell;
  REF_INT RVar1;
  REF_STATUS RVar2;
  uint uVar3;
  undefined8 uVar4;
  int cell;
  REF_INT nodes [27];
  REF_BOOL local_ac;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  REF_INT local_98;
  REF_INT local_94;
  REF_INT local_90;
  REF_INT local_8c;
  
  ref_cell = ref_shard->grid->cell[0xb];
  RVar1 = ref_cell->max;
  do {
    local_ac = 0;
    if (RVar1 < 1) {
      return 0;
    }
    cell = 0;
    do {
      RVar2 = ref_cell_nodes(ref_cell,cell,&local_a8);
      if (RVar2 == 0) {
        uVar3 = ref_shard_pair(ref_shard,&local_ac,local_a4,local_98,local_a0,local_8c);
        if (uVar3 != 0) {
          uVar4 = 0xf2;
LAB_0019b7c1:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 uVar4,"ref_shard_mark_relax",(ulong)uVar3,"not consist");
          return uVar3;
        }
        uVar3 = ref_shard_pair(ref_shard,&local_ac,local_94,local_a8,local_90,local_9c);
        if (uVar3 != 0) {
          uVar4 = 0xf5;
          goto LAB_0019b7c1;
        }
        uVar3 = ref_shard_pair(ref_shard,&local_ac,local_a4,local_90,local_a8,local_8c);
        if (uVar3 != 0) {
          uVar4 = 0xf9;
          goto LAB_0019b7c1;
        }
        uVar3 = ref_shard_pair(ref_shard,&local_ac,local_94,local_a0,local_98,local_9c);
        if (uVar3 != 0) {
          uVar4 = 0xfc;
          goto LAB_0019b7c1;
        }
        uVar3 = ref_shard_pair(ref_shard,&local_ac,local_a8,local_a0,local_98,local_90);
        if (uVar3 != 0) {
          uVar4 = 0x100;
          goto LAB_0019b7c1;
        }
        uVar3 = ref_shard_pair(ref_shard,&local_ac,local_a4,local_9c,local_94,local_8c);
        if (uVar3 != 0) {
          uVar4 = 0x103;
          goto LAB_0019b7c1;
        }
      }
      cell = cell + 1;
      RVar1 = ref_cell->max;
    } while (cell < RVar1);
    if (local_ac == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_relax(REF_SHARD ref_shard) {
  REF_CELL ref_cell;
  REF_BOOL again;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_hex(ref_shard_grid(ref_shard));

  again = REF_TRUE;

  while (again) {
    again = REF_FALSE;

    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[4], nodes[2],
                         nodes[7]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[5], nodes[0], nodes[6],
                         nodes[3]),
          "not consist");

      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[6], nodes[0],
                         nodes[7]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[5], nodes[2], nodes[4],
                         nodes[3]),
          "not consist");

      RSS(ref_shard_pair(ref_shard, &again, nodes[0], nodes[2], nodes[4],
                         nodes[6]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[3], nodes[5],
                         nodes[7]),
          "not consist");
    }
  }

  return REF_SUCCESS;
}